

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O2

size_t meassure_ff(_func_void *addr)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 in_RAX;
  undefined4 uVar3;
  
  uVar1 = rdtsc();
  uVar3 = (undefined4)((ulong)in_RAX >> 0x20);
  clflush(*addr);
  uVar2 = rdtsc();
  return (CONCAT44(uVar3,(int)uVar2) | uVar2 & 0xffffffff00000000) -
         (uVar1 & 0xffffffff00000000 | CONCAT44(uVar3,(int)uVar1));
}

Assistant:

size_t meassure_ff(void (* addr)(void))
{
    uint64_t start, end, delta;
    uint64_t lo, hi;
    asm volatile ("LFENCE");
    asm volatile ("RDTSC": "=a" (lo), "=d" (hi));
    start = (hi<<32) | lo;
    asm volatile ("LFENCE");

    asm volatile ("CLFLUSH 0(%0)\n":: "c" (addr): "rax");

    asm volatile ("MFENCE");
    asm volatile ("RDTSC": "=a" (lo), "=d" (hi));
    end = (hi<<32) | lo;
    asm volatile ("LFENCE");
    delta = end - start;
    return delta;

}